

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O3

void __thiscall chrono::fea::ChElementHexaCorot_20::UpdateRotation(ChElementHexaCorot_20 *this)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  bool bVar10;
  ulong uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  double dVar41;
  double dVar42;
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  double dVar97;
  ChMatrix33<double> rotXcurrent;
  ChMatrix33<double> rotX0;
  undefined1 local_138 [64];
  double *local_f8;
  double *pdStack_f0;
  double local_e8;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_c0;
  undefined8 local_b8;
  double local_b0;
  double local_a8;
  undefined8 local_a0;
  double local_98;
  double local_88;
  double dStack_80;
  double local_78;
  double local_70;
  undefined8 local_68;
  double local_60;
  double local_58;
  undefined8 local_50;
  double local_48;
  double local_38;
  double dStack_30;
  double local_28;
  
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_88);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_d8);
  dVar62 = local_78 + local_c8;
  dVar39 = local_88 + local_d8;
  dVar41 = dStack_80 + dStack_d0;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_f8);
  dVar39 = dVar39 + (double)local_f8;
  dVar41 = dVar41 + (double)pdStack_f0;
  dVar62 = dVar62 + local_e8;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_38);
  local_138._8_8_ = dVar41 + dStack_30;
  local_138._0_8_ = dVar39 + local_38;
  dVar62 = dVar62 + local_28;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[4].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_88);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[5].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_d8);
  dVar41 = local_88 + local_d8;
  dVar42 = dStack_80 + dStack_d0;
  dVar39 = local_78 + local_c8;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[6].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_f8);
  dVar41 = dVar41 + (double)local_f8;
  dVar42 = dVar42 + (double)pdStack_f0;
  dVar39 = dVar39 + local_e8;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[7].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_38);
  auVar21._0_8_ = dVar41 + local_38;
  auVar21._8_8_ = dVar42 + dStack_30;
  auVar26 = vsubpd_avx(auVar21,local_138._0_16_);
  dVar62 = (dVar39 + local_28) - dVar62;
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_88);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_d8);
  dVar39 = local_88 + local_d8;
  dVar41 = dStack_80 + dStack_d0;
  dVar42 = local_78 + local_c8;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[4].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_f8);
  dVar39 = dVar39 + (double)local_f8;
  dVar41 = dVar41 + (double)pdStack_f0;
  dVar42 = dVar42 + local_e8;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[5].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_38);
  dVar39 = dVar39 + local_38;
  dVar41 = dVar41 + dStack_30;
  dVar42 = dVar42 + local_28;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_88);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_d8);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[6].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_f8);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[7].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_38);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar62;
  dVar39 = (local_88 + local_d8 + (double)local_f8 + local_38) - dVar39;
  dVar41 = (dStack_80 + dStack_d0 + (double)pdStack_f0 + dStack_30) - dVar41;
  dVar42 = (local_78 + local_c8 + local_e8 + local_28) - dVar42;
  auVar28._0_8_ = auVar26._0_8_ * auVar26._0_8_;
  auVar28._8_8_ = auVar26._8_8_ * auVar26._8_8_;
  auVar21 = vshufpd_avx(auVar28,auVar28,1);
  auVar21 = vfmadd231sd_fma(auVar21,auVar26,auVar26);
  auVar21 = vfmadd231sd_fma(auVar21,auVar51,auVar51);
  auVar21 = vsqrtsd_avx(auVar21,auVar21);
  auVar37 = ZEXT816(0x3ff0000000000000);
  dVar55 = auVar21._0_8_;
  dVar45 = 1.0 / dVar55;
  uVar20 = 0;
  if (2.2250738585072014e-308 <= dVar55) {
    uVar20 = 0xff;
  }
  auVar27 = ZEXT816(0x3ff0000000000000);
  auVar56._8_8_ = dVar45;
  auVar56._0_8_ = dVar45;
  auVar21 = vmulpd_avx512vl(auVar26,auVar56);
  bVar10 = (bool)((byte)uVar20 & 1);
  auVar29._0_8_ = (double)((ulong)bVar10 * auVar21._0_8_ | (ulong)!bVar10 * 0x3ff0000000000000);
  auVar29._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * auVar21._8_8_;
  dVar62 = (double)((ulong)(2.2250738585072014e-308 <= dVar55) * (long)(dVar62 * dVar45));
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar62;
  auVar21 = vshufpd_avx(auVar29,auVar29,1);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar39;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar41 * dVar41;
  auVar26 = vfmadd231sd_fma(auVar71,auVar47,auVar47);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar42;
  auVar26 = vfmadd231sd_fma(auVar26,auVar63,auVar63);
  auVar26 = vsqrtsd_avx(auVar26,auVar26);
  dVar55 = auVar26._0_8_;
  dVar45 = 1.0 / dVar55;
  bVar10 = 2.2250738585072014e-308 <= dVar55;
  auVar26 = ZEXT816(0);
  dVar39 = dVar45 * dVar39;
  dVar42 = dVar45 * dVar42;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar39;
  auVar23._0_8_ = (double)((ulong)bVar10 * (long)dVar39 + (ulong)!bVar10 * 0x3ff0000000000000);
  auVar23._8_8_ = 0;
  dVar39 = (double)((ulong)bVar10 * (long)(dVar45 * dVar41));
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar39;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar42;
  dVar42 = (double)((ulong)bVar10 * (long)dVar42);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar42;
  dVar97 = auVar21._0_8_;
  if (((((auVar29._0_8_ != 0.0) || (NAN(auVar29._0_8_))) || (dVar97 != 0.0)) ||
      ((NAN(dVar97) || (dVar62 != 0.0)))) || (NAN(dVar62))) {
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar97 * dVar97;
    auVar21 = vfmadd231sd_fma(auVar52,auVar29,auVar29);
    auVar21 = vfmadd231sd_fma(auVar21,auVar22,auVar22);
    auVar21 = vsqrtsd_avx(auVar21,auVar21);
    dVar97 = auVar21._0_8_;
    dVar50 = 1.0 / dVar97;
    uVar20 = 0;
    if (2.2250738585072014e-308 <= dVar97) {
      uVar20 = 0xff;
    }
    auVar57._8_8_ = dVar50;
    auVar57._0_8_ = dVar50;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = (ulong)(2.2250738585072014e-308 <= dVar97) * (long)(dVar62 * dVar50);
    auVar21 = vmulpd_avx512vl(auVar29,auVar57);
    bVar10 = (bool)((byte)uVar20 & 1);
    auVar27._0_8_ = (ulong)bVar10 * auVar21._0_8_ | (ulong)!bVar10 * 0x3ff0000000000000;
    auVar27._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * auVar21._8_8_;
  }
  local_58 = auVar26._0_8_;
  auVar21 = vshufpd_avx(auVar27,auVar27,1);
  local_70 = auVar21._0_8_;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar39 * local_58;
  auVar28 = vfmsub231sd_fma(auVar91,auVar21,auVar25);
  local_78 = auVar28._0_8_;
  local_88 = auVar27._0_8_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = auVar23._0_8_ * local_70;
  auVar51 = vfmsub231sd_fma(auVar95,auVar27,auVar24);
  local_48 = auVar51._0_8_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar42 * local_88;
  auVar29 = vfmsub231sd_fma(auVar86,auVar26,auVar23);
  local_60 = auVar29._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_60 * local_60;
  auVar28 = vfmadd231sd_fma(auVar48,auVar28,auVar28);
  auVar28 = vfmadd231sd_fma(auVar28,auVar51,auVar51);
  auVar28 = vsqrtsd_avx(auVar28,auVar28);
  dVar62 = auVar28._0_8_;
  if (dVar62 < 0.0001) {
    if ((dVar55 < 2.2250738585072014e-308) ||
       (auVar13._8_8_ = 0x7fffffffffffffff, auVar13._0_8_ = 0x7fffffffffffffff,
       auVar28 = vandpd_avx512vl(auVar79,auVar13), 0.9 <= auVar28._0_8_)) {
      auVar28 = ZEXT816(0x3ff0000000000000);
      auVar30 = ZEXT816(0) << 0x40;
      if (dVar55 < 2.2250738585072014e-308) {
        auVar51 = ZEXT816(0);
      }
      else {
        auVar17._8_8_ = 0x7fffffffffffffff;
        auVar17._0_8_ = 0x7fffffffffffffff;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = dVar45 * dVar41;
        auVar29 = vandpd_avx512vl(auVar76,auVar17);
        auVar51 = ZEXT816(0) << 0x40;
        if (0.9 <= auVar29._0_8_) {
          auVar18._8_8_ = 0x7fffffffffffffff;
          auVar18._0_8_ = 0x7fffffffffffffff;
          auVar29 = vandpd_avx512vl(auVar64,auVar18);
          auVar28 = ZEXT816(0);
          uVar12 = vcmpsd_avx512f(auVar29,ZEXT816(0x3feccccccccccccd),5);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = (ulong)!(bool)((byte)uVar12 & 1) * 0x3ff0000000000000;
        }
      }
    }
    else {
      auVar51 = ZEXT816(0x3ff0000000000000);
      auVar30 = ZEXT816(0) << 0x40;
      auVar28 = ZEXT816(0) << 0x40;
    }
    auVar87._8_8_ = 0;
    auVar87._0_8_ = auVar30._0_8_ * -local_88;
    auVar29 = vfmadd231sd_fma(auVar87,auVar26,auVar51);
    auVar92._8_8_ = 0;
    auVar92._0_8_ = auVar28._0_8_ * -local_58;
    auVar22 = vfmadd231sd_fma(auVar92,auVar21,auVar30);
    local_78 = auVar22._0_8_;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = auVar51._0_8_ * -local_70;
    auVar28 = vfmadd231sd_fma(auVar96,auVar27,auVar28);
    local_48 = auVar28._0_8_;
    local_60 = auVar29._0_8_;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_60 * local_60;
    auVar51 = vfmadd231sd_fma(auVar65,auVar22,auVar22);
    auVar28 = vfmadd231sd_fma(auVar51,auVar28,auVar28);
    auVar28 = vsqrtsd_avx(auVar28,auVar28);
    dVar62 = auVar28._0_8_;
  }
  dVar62 = 1.0 / dVar62;
  local_60 = local_60 * dVar62;
  local_78 = local_78 * dVar62;
  local_48 = local_48 * dVar62;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_60;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = local_70 * local_48;
  auVar26 = vfmsub231sd_fma(auVar80,auVar77,auVar26);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = local_48;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = local_78 * local_58;
  auVar28 = vfmsub231sd_fma(auVar83,auVar66,auVar27);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_78;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = local_60 * local_88;
  auVar21 = vfmsub231sd_fma(auVar88,auVar72,auVar21);
  dStack_80 = auVar26._0_8_;
  local_68 = auVar28._0_8_;
  local_50 = auVar21._0_8_;
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar4 = psVar1[2].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar5 = psVar1[3].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar6 = psVar1[4].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar7 = psVar1[5].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar8 = psVar1[6].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar9 = psVar1[7].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar62 = *(double *)((long)&peVar4->super_ChNodeFEAbase + 0x20);
  dVar39 = *(double *)((long)&peVar5->super_ChNodeFEAbase + 0x20);
  dVar41 = *(double *)((long)&peVar6->super_ChNodeFEAbase + 0x20);
  dVar42 = *(double *)((long)&peVar7->super_ChNodeFEAbase + 0x20);
  dVar55 = *(double *)((long)&peVar8->super_ChNodeFEAbase + 0x20);
  dVar45 = *(double *)((long)&peVar9->super_ChNodeFEAbase + 0x20);
  dVar97 = *(double *)((long)&peVar2->super_ChNodeFEAbase + 0x20) +
           *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  dVar50 = (dVar41 + dVar42 + dVar55 + dVar45) - (dVar97 + dVar62 + dVar39);
  dVar62 = (dVar45 + dVar55 + dVar62 + dVar39) - (dVar42 + dVar41 + dVar97);
  dVar39 = *(double *)&peVar2->field_0x28 + *(double *)&peVar3->field_0x28;
  dVar41 = *(double *)&peVar2->field_0x30 + *(double *)&peVar3->field_0x30;
  auVar89._0_8_ =
       *(double *)&peVar6->field_0x28 + *(double *)&peVar7->field_0x28 +
       *(double *)&peVar8->field_0x28 + *(double *)&peVar9->field_0x28;
  auVar89._8_8_ =
       *(double *)&peVar6->field_0x30 + *(double *)&peVar7->field_0x30 +
       *(double *)&peVar8->field_0x30 + *(double *)&peVar9->field_0x30;
  auVar73._0_8_ = dVar39 + *(double *)&peVar4->field_0x28 + *(double *)&peVar5->field_0x28;
  auVar73._8_8_ = dVar41 + *(double *)&peVar4->field_0x30 + *(double *)&peVar5->field_0x30;
  auVar54._0_8_ = *(double *)&peVar7->field_0x28 + *(double *)&peVar6->field_0x28 + dVar39;
  auVar54._8_8_ = *(double *)&peVar7->field_0x30 + *(double *)&peVar6->field_0x30 + dVar41;
  auVar28 = vsubpd_avx(auVar89,auVar73);
  auVar67._0_8_ =
       *(double *)&peVar9->field_0x28 +
       *(double *)&peVar8->field_0x28 +
       *(double *)&peVar5->field_0x28 + *(double *)&peVar4->field_0x28;
  auVar67._8_8_ =
       *(double *)&peVar9->field_0x30 +
       *(double *)&peVar8->field_0x30 +
       *(double *)&peVar5->field_0x30 + *(double *)&peVar4->field_0x30;
  auVar51 = vsubpd_avx(auVar67,auVar54);
  auVar21 = vshufpd_avx(auVar28,auVar28,1);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar50;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = auVar28._0_8_ * auVar28._0_8_;
  auVar27 = vfmadd231sd_fma(auVar68,auVar58,auVar58);
  auVar26 = vshufpd_avx(auVar51,auVar51,1);
  auVar21 = vfmadd213sd_fma(auVar21,auVar21,auVar27);
  auVar21 = vsqrtsd_avx(auVar21,auVar21);
  dVar39 = auVar21._0_8_;
  auVar69._0_8_ = 1.0 / dVar39;
  uVar20 = 0xff;
  if (dVar39 < 2.2250738585072014e-308) {
    uVar20 = 0;
  }
  auVar69._8_8_ = auVar69._0_8_;
  auVar31._0_8_ =
       (double)((ulong)(2.2250738585072014e-308 <= dVar39) * (long)(dVar50 * auVar69._0_8_) +
               (ulong)(2.2250738585072014e-308 > dVar39) * 0x3ff0000000000000);
  auVar31._8_8_ = 0;
  dVar42 = auVar51._0_8_;
  auVar21 = vmulpd_avx512vl(auVar28,auVar69);
  dVar39 = (double)((ulong)((byte)uVar20 & 1) * auVar21._0_8_);
  auVar32._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * auVar21._8_8_;
  auVar32._0_8_ = dVar39;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar62;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar42 * dVar42;
  auVar21 = vfmadd231sd_fma(auVar59,auVar53,auVar53);
  auVar21 = vfmadd231sd_fma(auVar21,auVar26,auVar26);
  auVar21 = vsqrtsd_avx(auVar21,auVar21);
  dVar45 = auVar21._0_8_;
  dVar55 = 1.0 / dVar45;
  bVar10 = 2.2250738585072014e-308 <= dVar45;
  dVar62 = dVar62 * dVar55;
  auVar36 = ZEXT816(0);
  dVar41 = auVar26._0_8_ * dVar55;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar62;
  auVar33._0_8_ = (double)((ulong)bVar10 * (long)dVar62 + (ulong)!bVar10 * 0x3ff0000000000000);
  auVar33._8_8_ = 0;
  dVar62 = (double)((ulong)bVar10 * (long)(dVar42 * dVar55));
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar62;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar41;
  dVar41 = (double)((ulong)bVar10 * (long)dVar41);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar41;
  if ((auVar31._0_8_ == 0.0) && (!NAN(auVar31._0_8_))) {
    uVar11 = vcmppd_avx512vl(auVar32,ZEXT816(0) << 0x40,0);
    if (((uVar11 & 1) != 0) && (local_a8 = 0.0, (uVar11 & 3) >> 1 != 0)) goto LAB_006bbe6a;
  }
  auVar21 = vshufpd_avx(auVar32,auVar32,1);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar39 * dVar39;
  auVar26 = vfmadd231sd_fma(auVar40,auVar31,auVar31);
  auVar26 = vfmadd231sd_fma(auVar26,auVar21,auVar21);
  auVar26 = vsqrtsd_avx(auVar26,auVar26);
  dVar97 = 1.0 / auVar26._0_8_;
  bVar10 = 2.2250738585072014e-308 <= auVar26._0_8_;
  local_a8 = (double)((ulong)bVar10 * (long)(dVar97 * auVar21._0_8_));
  auVar36._8_8_ = 0;
  auVar36._0_8_ = (ulong)bVar10 * (long)(dVar39 * dVar97);
  auVar37._0_8_ =
       (ulong)bVar10 * (long)(auVar31._0_8_ * dVar97) + (ulong)!bVar10 * 0x3ff0000000000000;
  auVar37._8_8_ = 0;
LAB_006bbe6a:
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_a8;
  local_d8 = auVar37._0_8_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar41 * local_d8;
  auVar21 = vfmsub231sd_fma(auVar93,auVar19,auVar33);
  local_c0 = auVar36._0_8_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar62 * local_a8;
  auVar26 = vfmsub231sd_fma(auVar81,auVar36,auVar35);
  local_c8 = auVar26._0_8_;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = auVar33._0_8_ * local_c0;
  auVar28 = vfmsub231sd_fma(auVar84,auVar37,auVar34);
  local_98 = auVar28._0_8_;
  local_b0 = auVar21._0_8_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = local_b0 * local_b0;
  auVar21 = vfmadd231sd_fma(auVar90,auVar26,auVar26);
  auVar21 = vfmadd231sd_fma(auVar21,auVar28,auVar28);
  auVar21 = vsqrtsd_avx(auVar21,auVar21);
  dVar62 = auVar21._0_8_;
  if (dVar62 < 0.0001) {
    if ((dVar45 < 2.2250738585072014e-308) ||
       (auVar14._8_8_ = 0x7fffffffffffffff, auVar14._0_8_ = 0x7fffffffffffffff,
       auVar21 = vandpd_avx512vl(auVar78,auVar14), 0.9 <= auVar21._0_8_)) {
      auVar21 = ZEXT816(0x3ff0000000000000);
      auVar38 = ZEXT816(0) << 0x40;
      if (dVar45 < 2.2250738585072014e-308) {
        auVar26 = ZEXT816(0);
      }
      else {
        auVar15._8_8_ = 0x7fffffffffffffff;
        auVar15._0_8_ = 0x7fffffffffffffff;
        auVar74._8_8_ = 0;
        auVar74._0_8_ = dVar42 * dVar55;
        auVar28 = vandpd_avx512vl(auVar74,auVar15);
        auVar26 = ZEXT816(0) << 0x40;
        if (0.9 <= auVar28._0_8_) {
          auVar16._8_8_ = 0x7fffffffffffffff;
          auVar16._0_8_ = 0x7fffffffffffffff;
          auVar28 = vandpd_avx512vl(auVar60,auVar16);
          auVar21 = ZEXT816(0);
          uVar12 = vcmpsd_avx512f(auVar28,ZEXT816(0x3feccccccccccccd),5);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = (ulong)!(bool)((byte)uVar12 & 1) * 0x3ff0000000000000;
        }
      }
    }
    else {
      auVar26 = ZEXT816(0x3ff0000000000000);
      auVar38 = ZEXT816(0) << 0x40;
      auVar21 = ZEXT816(0);
    }
    auVar94._8_8_ = 0;
    auVar94._0_8_ = auVar38._0_8_ * -local_d8;
    auVar28 = vfmadd231sd_fma(auVar94,auVar19,auVar26);
    auVar82._8_8_ = 0;
    auVar82._0_8_ = -local_a8 * auVar21._0_8_;
    auVar51 = vfmadd231sd_fma(auVar82,auVar36,auVar38);
    local_c8 = auVar51._0_8_;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = auVar26._0_8_ * -local_c0;
    auVar21 = vfmadd231sd_fma(auVar85,auVar37,auVar21);
    local_98 = auVar21._0_8_;
    local_b0 = auVar28._0_8_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_b0 * local_b0;
    auVar26 = vfmadd231sd_fma(auVar43,auVar51,auVar51);
    auVar21 = vfmadd231sd_fma(auVar26,auVar21,auVar21);
    auVar21 = vsqrtsd_avx(auVar21,auVar21);
    dVar62 = auVar21._0_8_;
  }
  dVar62 = 1.0 / dVar62;
  local_c8 = local_c8 * dVar62;
  local_b0 = local_b0 * dVar62;
  local_98 = local_98 * dVar62;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_b0;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_c0 * local_98;
  auVar21 = vfmsub231sd_fma(auVar61,auVar49,auVar19);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_98;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_a8 * local_c8;
  auVar26 = vfmsub231sd_fma(auVar70,auVar44,auVar37);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_c8;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = local_d8 * local_b0;
  auVar37 = vfmsub231sd_fma(auVar75,auVar46,auVar36);
  dStack_d0 = auVar21._0_8_;
  local_b8 = auVar26._0_8_;
  local_a0 = auVar37._0_8_;
  local_f8 = &local_d8;
  pdStack_f0 = &local_88;
  ChMatrix33<double>::operator=
            (&(this->super_ChElementCorotational).A,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>_>
              *)&local_f8);
  return;
}

Assistant:

void ChElementHexaCorot_20::UpdateRotation() {
    ChVector<> avgX1;
    avgX1 = nodes[0]->GetX0() + nodes[1]->GetX0() + nodes[2]->GetX0() + nodes[3]->GetX0();
    ChVector<> avgX2;
    avgX2 = nodes[4]->GetX0() + nodes[5]->GetX0() + nodes[6]->GetX0() + nodes[7]->GetX0();
    ChVector<> Xdir = avgX2 - avgX1;

    ChVector<> avgY1;
    avgY1 = nodes[0]->GetX0() + nodes[1]->GetX0() + nodes[4]->GetX0() + nodes[5]->GetX0();
    ChVector<> avgY2;
    avgY2 = nodes[2]->GetX0() + nodes[3]->GetX0() + nodes[6]->GetX0() + nodes[7]->GetX0();
    ChVector<> Ydir = avgY2 - avgY1;
    ChMatrix33<> rotX0;
    rotX0.Set_A_Xdir(Xdir.GetNormalized(), Ydir.GetNormalized());

    avgX1 = nodes[0]->pos + nodes[1]->pos + nodes[2]->pos + nodes[3]->pos;
    avgX2 = nodes[4]->pos + nodes[5]->pos + nodes[6]->pos + nodes[7]->pos;
    Xdir = avgX2 - avgX1;

    avgY1 = nodes[0]->pos + nodes[1]->pos + nodes[4]->pos + nodes[5]->pos;
    avgY2 = nodes[2]->pos + nodes[3]->pos + nodes[6]->pos + nodes[7]->pos;
    Ydir = avgY2 - avgY1;
    ChMatrix33<> rotXcurrent;
    rotXcurrent.Set_A_Xdir(Xdir.GetNormalized(), Ydir.GetNormalized());

    this->A = rotXcurrent * rotX0.transpose();
}